

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::lts_20250127::debugging_internal::ParseNumber(State *state,int *number_out)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  
  iVar3 = state->recursion_depth;
  iVar7 = state->steps;
  state->recursion_depth = iVar3 + 1;
  state->steps = iVar7 + 1;
  if (iVar7 < 0x20000 && iVar3 < 0x100) {
    bVar4 = ParseOneCharToken(state,'n');
    iVar3 = (state->parse_state).mangled_idx;
    pcVar5 = state->mangled_begin + iVar3;
    iVar7 = 0;
    bVar2 = state->mangled_begin[iVar3];
    pcVar6 = pcVar5;
    while ((byte)(bVar2 - 0x30) < 10) {
      iVar7 = (uint)bVar2 + iVar7 * 10 + -0x30;
      pbVar1 = (byte *)(pcVar6 + 1);
      pcVar6 = pcVar6 + 1;
      bVar2 = *pbVar1;
    }
    iVar8 = -iVar7;
    if (!bVar4) {
      iVar8 = iVar7;
    }
    bVar4 = pcVar6 != pcVar5;
    if (bVar4) {
      (state->parse_state).mangled_idx = ((int)pcVar6 - (int)pcVar5) + iVar3;
      bVar4 = true;
      if (number_out != (int *)0x0) {
        *number_out = iVar8;
      }
    }
  }
  else {
    bVar4 = false;
  }
  state->recursion_depth = state->recursion_depth + -1;
  return bVar4;
}

Assistant:

static bool ParseNumber(State *state, int *number_out) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  bool negative = false;
  if (ParseOneCharToken(state, 'n')) {
    negative = true;
  }
  const char *p = RemainingInput(state);
  uint64_t number = 0;
  for (; *p != '\0'; ++p) {
    if (IsDigit(*p)) {
      number = number * 10 + static_cast<uint64_t>(*p - '0');
    } else {
      break;
    }
  }
  // Apply the sign with uint64_t arithmetic so overflows aren't UB.  Gives
  // "incorrect" results for out-of-range inputs, but negative values only
  // appear for literals, which aren't printed.
  if (negative) {
    number = ~number + 1;
  }
  if (p != RemainingInput(state)) {  // Conversion succeeded.
    state->parse_state.mangled_idx += p - RemainingInput(state);
    UpdateHighWaterMark(state);
    if (number_out != nullptr) {
      // Note: possibly truncate "number".
      *number_out = static_cast<int>(number);
    }
    return true;
  }
  return false;
}